

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O3

bool __thiscall
absl::CUnescape(absl *this,string_view source,Nonnull<std::string_*> dest,
               Nullable<std::string_*> error)

{
  absl *paVar1;
  absl aVar2;
  uint uVar3;
  long lVar4;
  size_t sVar5;
  undefined8 *puVar6;
  long *plVar7;
  absl *paVar8;
  AlphaNum *b;
  size_type *psVar9;
  ulong *puVar10;
  absl *paVar11;
  uint uVar12;
  char32_t cVar13;
  char32_t utf8_char;
  absl *paVar14;
  char *pcVar15;
  _Alloc_hider _Var16;
  absl *paVar17;
  absl *paVar18;
  absl *buffer;
  ulong uVar19;
  undefined1 local_c0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_60;
  absl *local_40;
  absl *local_38;
  
  puVar10 = (ulong *)source._M_str;
  paVar14 = (absl *)source._M_len;
  std::__cxx11::string::resize((ulong)puVar10,(char)this);
  paVar17 = (absl *)*puVar10;
  paVar1 = paVar14 + (long)this;
  paVar18 = paVar17;
  paVar8 = paVar14;
  paVar11 = paVar14;
  buffer = paVar17;
  if (0 < (long)this && paVar17 == paVar14) {
    while (paVar11 = paVar8, buffer = paVar18, *paVar8 != (absl)0x5c) {
      paVar11 = paVar8 + 1;
      buffer = paVar18 + 1;
      if ((paVar8 != paVar18) || (paVar18 = buffer, paVar8 = paVar11, paVar1 <= paVar11)) break;
    }
  }
  if (paVar11 < paVar1) {
    paVar18 = this + (long)paVar14 + -1;
    do {
      if (*paVar11 != (absl)0x5c) {
        *buffer = *paVar11;
LAB_0026df42:
        buffer = buffer + 1;
        paVar8 = paVar11;
        goto LAB_0026e0eb;
      }
      paVar8 = paVar11 + 1;
      if (paVar18 < paVar8) {
        if (dest == (Nonnull<std::string_*>)0x0) {
          return false;
        }
        std::__cxx11::string::_M_replace((ulong)dest,0,(char *)dest->_M_string_length,0x5942d0);
        return false;
      }
      aVar2 = *paVar8;
      if ((byte)aVar2 < 0x55) {
        if ((byte)aVar2 < 0x30) {
          if (aVar2 == (absl)0x22) {
            *buffer = (absl)0x22;
          }
          else {
            if (aVar2 != (absl)0x27) goto switchD_0026de9a_caseD_6f;
            *buffer = (absl)0x27;
          }
        }
        else {
          uVar3 = (byte)aVar2 - 0x30;
          if (uVar3 < 8) {
            paVar14 = paVar8;
            if ((paVar8 < paVar18) && (((byte)paVar11[2] & 0xf8) == 0x30)) {
              uVar3 = ((uint)(byte)paVar11[2] + uVar3 * 8) - 0x30;
              paVar14 = paVar11 + 2;
            }
            if ((paVar14 < paVar18) && (((byte)paVar14[1] & 0xf8) == 0x30)) {
              uVar3 = ((uint)(byte)paVar14[1] + uVar3 * 8) - 0x30;
              if (0xff < uVar3) {
                if (dest == (Nonnull<std::string_*>)0x0) {
                  return false;
                }
                local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_60,paVar8,paVar14 + 2);
                puVar6 = (undefined8 *)
                         std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x5942e9);
                local_c0._0_8_ = local_c0 + 0x10;
                psVar9 = puVar6 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar9) {
                  local_c0._16_8_ = *psVar9;
                  local_c0._24_8_ = puVar6[3];
                }
                else {
                  local_c0._16_8_ = *psVar9;
                  local_c0._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar6;
                }
                local_c0._8_8_ = puVar6[1];
                *puVar6 = psVar9;
                puVar6[1] = 0;
                *(undefined1 *)(puVar6 + 2) = 0;
                plVar7 = (long *)std::__cxx11::string::append(local_c0);
                goto LAB_0026e2f1;
              }
              paVar11 = paVar14 + 1;
LAB_0026df3f:
              *buffer = SUB41(uVar3,0);
            }
            else {
              *buffer = SUB41(uVar3,0);
              paVar11 = paVar14;
            }
            goto LAB_0026df42;
          }
          if (aVar2 != (absl)0x3f) goto switchD_0026de9a_caseD_6f;
          *buffer = (absl)0x3f;
        }
        goto LAB_0026e0e5;
      }
      if ((byte)aVar2 < 0x62) {
        if ((byte)aVar2 < 0x5c) {
          if (aVar2 == (absl)0x55) {
            paVar14 = paVar11 + 9;
            if (paVar14 < paVar1) {
              paVar11 = paVar11 + 2;
              b = (AlphaNum *)0x8;
              utf8_char = L'\0';
              do {
                cVar13 = utf8_char;
                aVar2 = *paVar11;
                if (-1 < (char)(&ascii_internal::kPropertyBits)[(byte)aVar2]) {
                  if (dest == (Nonnull<std::string_*>)0x0) {
                    return false;
                  }
                  local_c0._0_8_ = local_c0 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0);
                  plVar7 = (long *)std::__cxx11::string::replace
                                             ((ulong)local_c0,0,(char *)0x0,0x59436c);
                  goto LAB_0026e240;
                }
                if (0x10fff < (uint)cVar13) {
                  if (dest == (Nonnull<std::string_*>)0x0) {
                    return false;
                  }
                  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_60,paVar8,paVar11 + 1);
                  plVar7 = (long *)std::__cxx11::string::replace
                                             ((ulong)&local_60,0,(char *)0x0,0x5942e9);
                  local_c0._0_8_ = local_c0 + 0x10;
                  psVar9 = (size_type *)(plVar7 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar7 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar9) {
                    local_c0._16_8_ = *psVar9;
                    local_c0._24_8_ = plVar7[3];
                  }
                  else {
                    local_c0._16_8_ = *psVar9;
                    local_c0._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)*plVar7;
                  }
                  local_c0._8_8_ = plVar7[1];
                  *plVar7 = (long)psVar9;
                  plVar7[1] = 0;
                  *(undefined1 *)(plVar7 + 2) = 0;
                  plVar7 = (long *)std::__cxx11::string::append(local_c0);
                  goto LAB_0026e2f1;
                }
                uVar3 = (byte)aVar2 + 9;
                if ((byte)aVar2 < 0x3a) {
                  uVar3 = (uint)(byte)aVar2;
                }
                utf8_char = cVar13 << 4 | uVar3 & 0xf;
                paVar11 = paVar11 + 1;
                uVar3 = (int)b - 1;
                b = (AlphaNum *)(ulong)uVar3;
              } while (uVar3 != 0);
              uVar3 = cVar13 & 0x1ff80;
              if ((dest == (Nonnull<std::string_*>)0x0) || (uVar3 != 0xd80))
              goto joined_r0x0026dfea;
              local_c0._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x9;
              goto LAB_0026e654;
            }
            if (dest == (Nonnull<std::string_*>)0x0) {
              return false;
            }
            local_c0._0_8_ = local_c0 + 0x10;
            local_c0._8_8_ = (absl *)0x1;
            local_c0[0x11] = 0;
            local_c0[0x10] = *paVar8;
            plVar7 = (long *)std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0x59436c);
            goto LAB_0026e240;
          }
          if (aVar2 == (absl)0x58) goto switchD_0026de9a_caseD_78;
          goto switchD_0026de9a_caseD_6f;
        }
        if (aVar2 == (absl)0x5c) {
          *buffer = (absl)0x5c;
        }
        else {
          if (aVar2 != (absl)0x61) goto switchD_0026de9a_caseD_6f;
          *buffer = (absl)0x7;
        }
        goto LAB_0026e0e5;
      }
      switch(aVar2) {
      case (absl)0x6e:
        *buffer = (absl)0xa;
        break;
      case (absl)0x6f:
      case (absl)0x70:
      case (absl)0x71:
      case (absl)0x73:
      case (absl)0x77:
switchD_0026de9a_caseD_6f:
        if (dest == (Nonnull<std::string_*>)0x0) {
          return false;
        }
        local_c0._0_8_ = local_c0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_c0,"Unknown escape sequence: \\","");
        std::operator+(&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ,(char)*paVar8);
        std::__cxx11::string::operator=((string *)dest,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
LAB_0026e29c:
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0026e2a9;
      case (absl)0x72:
        *buffer = (absl)0xd;
        break;
      case (absl)0x74:
        *buffer = (absl)0x9;
        break;
      case (absl)0x75:
        paVar14 = paVar11 + 5;
        if (paVar14 < paVar1) {
          lVar4 = 0;
          utf8_char = L'\0';
          do {
            cVar13 = utf8_char;
            aVar2 = paVar11[lVar4 + 2];
            if (-1 < (char)(&ascii_internal::kPropertyBits)[(byte)aVar2]) {
              if (dest == (Nonnull<std::string_*>)0x0) {
                return false;
              }
              local_c0._0_8_ = local_c0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_c0,paVar8,paVar11 + lVar4 + 2);
              plVar7 = (long *)std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0x594345)
              ;
              goto LAB_0026e240;
            }
            uVar3 = (byte)aVar2 + 9;
            if ((byte)aVar2 < 0x3a) {
              uVar3 = (uint)(byte)aVar2;
            }
            utf8_char = uVar3 & 0xf | cVar13 << 4;
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 4);
          uVar3 = cVar13 & 0xfffff80;
          b = (AlphaNum *)(ulong)uVar3;
          if ((dest != (Nonnull<std::string_*>)0x0) && (uVar3 == 0xd80)) {
            local_c0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x5;
LAB_0026e654:
            local_90._M_string_length = 0x594442;
            local_90._M_dataplus._M_p = (pointer)0x2c;
            local_c0._8_8_ = paVar8;
            StrCat_abi_cxx11_(&local_60,(absl *)&local_90,(AlphaNum *)local_c0,b);
            std::__cxx11::string::operator=((string *)dest,(string *)&local_60);
            _Var16._M_p = local_60._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p == &local_60.field_2) {
              return false;
            }
            goto LAB_0026e380;
          }
joined_r0x0026dfea:
          local_40 = paVar14;
          if (uVar3 == 0xd80) {
            return false;
          }
          local_38 = paVar17;
          sVar5 = strings_internal::EncodeUTF8Char((char *)buffer,utf8_char);
          buffer = buffer + sVar5;
          paVar8 = local_40;
          paVar17 = local_38;
          goto LAB_0026e0eb;
        }
        if (dest == (Nonnull<std::string_*>)0x0) {
          return false;
        }
        local_c0._0_8_ = local_c0 + 0x10;
        local_c0._8_8_ = (absl *)0x1;
        local_c0[0x11] = 0;
        local_c0[0x10] = *paVar8;
        plVar7 = (long *)std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0x594345);
LAB_0026e240:
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_90.field_2._M_allocated_capacity = *psVar9;
          local_90.field_2._8_8_ = plVar7[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar9;
          local_90._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_90._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)dest,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_0026e29c;
LAB_0026e2a9:
        local_60.field_2._M_allocated_capacity = local_c0._16_8_;
        _Var16._M_p = (pointer)local_c0._0_8_;
        if ((undefined1 *)local_c0._0_8_ == local_c0 + 0x10) {
          return false;
        }
LAB_0026e380:
        operator_delete(_Var16._M_p,local_60.field_2._M_allocated_capacity + 1);
        return false;
      case (absl)0x76:
        *buffer = (absl)0xb;
        break;
      case (absl)0x78:
switchD_0026de9a_caseD_78:
        if (paVar18 <= paVar8) {
          if (dest == (Nonnull<std::string_*>)0x0) {
            return false;
          }
          pcVar15 = "String cannot end with \\x";
LAB_0026e3c2:
          std::__cxx11::string::operator=((string *)dest,pcVar15);
          return false;
        }
        if (-1 < (char)(&ascii_internal::kPropertyBits)[(byte)paVar11[2]]) {
          if (dest == (Nonnull<std::string_*>)0x0) {
            return false;
          }
          pcVar15 = "\\x cannot be followed by a non-hex digit";
          goto LAB_0026e3c2;
        }
        uVar3 = 0;
        paVar11 = paVar8;
        do {
          aVar2 = paVar11[1];
          if (-1 < (char)(&ascii_internal::kPropertyBits)[(byte)aVar2]) break;
          paVar11 = paVar11 + 1;
          uVar12 = (byte)aVar2 + 9;
          if ((byte)aVar2 < 0x3a) {
            uVar12 = (uint)(byte)aVar2;
          }
          uVar3 = uVar3 << 4 | uVar12 & 0xf;
        } while (paVar11 < paVar18);
        if (uVar3 < 0x100) goto LAB_0026df3f;
        if (dest == (Nonnull<std::string_*>)0x0) {
          return false;
        }
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,paVar8,paVar11 + 1);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x5942e9);
        local_c0._0_8_ = local_c0 + 0x10;
        psVar9 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_c0._16_8_ = *psVar9;
          local_c0._24_8_ = puVar6[3];
        }
        else {
          local_c0._16_8_ = *psVar9;
          local_c0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar6;
        }
        local_c0._8_8_ = puVar6[1];
        *puVar6 = psVar9;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append(local_c0);
LAB_0026e2f1:
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_90.field_2._M_allocated_capacity = *psVar9;
          local_90.field_2._8_8_ = plVar7[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar9;
          local_90._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_90._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)dest,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
          operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
        }
        _Var16._M_p = local_60._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p == &local_60.field_2) {
          return false;
        }
        goto LAB_0026e380;
      default:
        if (aVar2 == (absl)0x62) {
          *buffer = (absl)0x8;
        }
        else {
          if (aVar2 != (absl)0x66) goto switchD_0026de9a_caseD_6f;
          *buffer = (absl)0xc;
        }
      }
LAB_0026e0e5:
      buffer = buffer + 1;
LAB_0026e0eb:
      paVar11 = paVar8 + 1;
    } while (paVar11 < paVar1);
  }
  uVar19 = (long)buffer - (long)paVar17;
  if (puVar10[1] < uVar19) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",uVar19
              );
  }
  puVar10[1] = uVar19;
  *(undefined1 *)(*puVar10 + uVar19) = 0;
  return true;
}

Assistant:

bool CUnescape(absl::string_view source, absl::Nonnull<std::string*> dest,
               absl::Nullable<std::string*> error) {
  return CUnescapeInternal(source, kUnescapeNulls, dest, error);
}